

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qotd.cc
# Opt level: O3

int main(int argc,char **argv)

{
  _Manager_type p_Var1;
  _Any_data _Var2;
  uint uVar3;
  pointer pbVar4;
  void *pvVar5;
  size_t __i;
  long lVar6;
  int extraout_EDX;
  int extraout_EDX_00;
  int __n;
  int __fd;
  uniform_int_distribution<unsigned_long> distribution;
  random_device rd;
  mt19937 rng;
  _Any_data __tmp;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2798;
  _Any_data local_2778;
  pointer local_2768;
  _Invoker_type local_2760;
  undefined8 local_2750;
  long local_2748;
  anon_union_5000_2_650ea050_for_random_device_0 local_2740;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_13b8 [208];
  undefined8 local_38;
  _Any_data *p_Var7;
  
  local_2798.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_2798.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_2798.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (argc < 2) {
    local_2740.field_0._M_file = &local_2740.field_0._M_fd;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_2740,"Sorry, no quote today, mate.\n","");
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    _M_assign_aux<std::__cxx11::string_const*>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_2798,
               &local_2740,local_2740._M_mt._M_x + 4);
    if ((int *)local_2740.field_0._M_file == &local_2740.field_0._M_fd) goto LAB_00108951;
  }
  else {
    std::__cxx11::string::string((string *)&local_2740.field_0,argv[1],(allocator *)&local_2750);
    readQuotes((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_2778,(string *)&local_2740.field_0);
    local_13b8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_2798.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    local_13b8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_2798.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_13b8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start =
         local_2798.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_2798.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = local_2768;
    local_2798.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_2778._M_unused._0_8_;
    local_2798.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_2778._8_8_;
    local_2778 = (_Any_data)ZEXT816(0);
    local_2768 = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_13b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_2778);
    if ((int *)local_2740.field_0._M_file == &local_2740.field_0._M_fd) goto LAB_00108951;
  }
  operator_delete(local_2740.field_0._M_file);
LAB_00108951:
  std::random_device::random_device((random_device *)&local_2740.field_0);
  uVar3 = std::random_device::_M_getval();
  local_13b8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)(ulong)uVar3;
  lVar6 = 1;
  pbVar4 = local_13b8[0].
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    pbVar4 = (pointer)(ulong)(((uint)((ulong)pbVar4 >> 0x1e) ^ (uint)pbVar4) * 0x6c078965 +
                             (int)lVar6);
    (&local_13b8[0].
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start)[lVar6] = pbVar4;
    lVar6 = lVar6 + 1;
  } while (lVar6 != 0x270);
  local_38 = 0x270;
  local_2748 = ((long)local_2798.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_2798.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5) + -1;
  local_2750 = 0;
  signal(2,handleExitSignal);
  __fd = 0x411;
  Server::setPort(&server,0x411);
  local_2778._8_8_ = 0;
  pvVar5 = operator_new(0x18);
  *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    **)pvVar5 = &local_2798;
  *(undefined8 **)((long)pvVar5 + 8) = &local_2750;
  *(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    **)((long)pvVar5 + 0x10) = local_13b8;
  p_Var1 = server._handleAccept.super__Function_base._M_manager;
  local_2778._M_unused._M_object = pvVar5;
  _Var2 = local_2778;
  local_2778 = server._handleAccept.super__Function_base._M_functor;
  server._handleAccept.super__Function_base._M_functor = _Var2;
  local_2768 = (pointer)server._handleAccept.super__Function_base._M_manager;
  server._handleAccept.super__Function_base._M_manager =
       std::
       _Function_handler<void_(std::weak_ptr<ClientSocket>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Pseudomanifold[P]SimpleServer/qotd.cc:65:20)>
       ::_M_manager;
  local_2760 = server._handleAccept._M_invoker;
  server._handleAccept._M_invoker =
       std::
       _Function_handler<void_(std::weak_ptr<ClientSocket>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Pseudomanifold[P]SimpleServer/qotd.cc:65:20)>
       ::_M_invoke;
  __n = extraout_EDX;
  if (p_Var1 != (_Manager_type)0x0) {
    p_Var7 = &local_2778;
    (*p_Var1)(p_Var7,p_Var7,__destroy_functor);
    __fd = (int)p_Var7;
    __n = extraout_EDX_00;
  }
  Server::listen(&server,__fd,__n);
  std::random_device::_M_fini();
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2798);
  return 0;
}

Assistant:

int main( int argc, char** argv )
{
  std::vector<std::string> quotes;

  if( argc > 1 )
    quotes = readQuotes( argv[1] );
  else
    quotes = { "Sorry, no quote today, mate.\n" };

  std::random_device rd;
  std::mt19937 rng( rd() );
  std::uniform_int_distribution<std::size_t> distribution( 0, quotes.size() - 1 );

  signal( SIGINT, handleExitSignal );

  server.setPort( 1041 );

  server.onAccept( [&] ( std::weak_ptr<ClientSocket> socket )
  {
    if( auto s = socket.lock() )
    {
      s->write( quotes.at( distribution( rng ) ) );
      s->close();
    }
  } );

  server.listen();

  return 0;
}